

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

UBool isCanonSegmentStarter(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UBool UVar1;
  Normalizer2Impl *this;
  UErrorCode errorCode;
  UErrorCode local_1c;
  
  local_1c = U_ZERO_ERROR;
  this = icu_63::Normalizer2Factory::getNFCImpl(&local_1c);
  if ((local_1c < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = icu_63::Normalizer2Impl::ensureCanonIterData(this,&local_1c), UVar1 != '\0')) {
    UVar1 = icu_63::Normalizer2Impl::isCanonSegmentStarter(this,c);
    return UVar1 != '\0';
  }
  return '\0';
}

Assistant:

static UBool isCanonSegmentStarter(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    return
        U_SUCCESS(errorCode) && impl->ensureCanonIterData(errorCode) &&
        impl->isCanonSegmentStarter(c);
}